

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void expandFormatArguments<String,String,StringList>
               (vector<String,_std::allocator<String>_> *data,String *arg,String *rest,
               StringList *rest_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  value_type local_48;
  
  paVar1 = &local_48._string.field_2;
  pcVar2 = (arg->_string)._M_dataplus._M_p;
  local_48._string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (arg->_string)._M_string_length);
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._string._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._string._M_dataplus._M_p);
  }
  expandFormatArguments<String,StringList>(data,rest,rest_1);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}